

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_Buffer::WriteToBinaryArchive(ON_Buffer *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON__UINT32 i;
  size_t local_40;
  ON__UINT64 seg_size;
  ON_BUFFER_SEGMENT *seg;
  ON__UINT64 size;
  bool buffer_rc;
  bool rc;
  ON__UINT32 buffer_crc;
  ON_BinaryArchive *archive_local;
  ON_Buffer *this_local;
  
  i = CRC32(this,0);
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x28100,1,0);
  if (bVar1) {
    this_local._7_1_ = false;
    bVar1 = ON_BinaryArchive::WriteBigInt(archive,this->m_buffer_size);
    if ((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(archive,i), bVar1)) {
      seg = (ON_BUFFER_SEGMENT *)0x0;
      seg_size = (ON__UINT64)this->m_first_segment;
      while( true ) {
        bVar1 = false;
        if (seg_size != 0) {
          bVar1 = seg < (ON_BUFFER_SEGMENT *)this->m_buffer_size;
        }
        if (!bVar1) break;
        if ((*(long *)(seg_size + 0x20) != 0) &&
           (*(ulong *)(seg_size + 0x10) < *(ulong *)(seg_size + 0x18))) {
          local_40 = *(long *)(seg_size + 0x18) - *(long *)(seg_size + 0x10);
          if (this->m_buffer_size < local_40 + (long)seg) {
            local_40 = this->m_buffer_size - (long)seg;
          }
          bVar1 = ON_BinaryArchive::WriteByte(archive,local_40,*(void **)(seg_size + 0x20));
          if (!bVar1) break;
          seg = (ON_BUFFER_SEGMENT *)((long)&seg->m_prev_segment + local_40);
        }
        seg_size = *(ON__UINT64 *)(seg_size + 8);
      }
      this_local._7_1_ = true;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Buffer::WriteToBinaryArchive( ON_BinaryArchive& archive ) const
{
  // The ON_Buffer::CRC32() calculation will call ON_ERROR if the segment list
  // is not perfect.  The code below that goes through the segments
  // checks for errors so that crashes are avoided, but does not make
  // additional calls to ON_ERROR.
  ON__UINT32 buffer_crc = CRC32(0);

  if ( !archive.BeginWrite3dmChunk(TCODE_OPENNURBS_BUFFER,1,0) )
    return false;

  bool rc = false;
  for(;;)
  {
    if ( !archive.WriteBigInt(m_buffer_size) )
      break;
    if ( !archive.WriteInt(buffer_crc) )
      break;

    bool buffer_rc = true;
    ON__UINT64 size = 0;
    for ( struct ON_BUFFER_SEGMENT* seg = m_first_segment; 
          0 != seg && size < m_buffer_size; 
          seg = seg->m_next_segment 
        )
    {
      if ( 0 == seg->m_segment_buffer )
        continue;
      if ( seg->m_segment_position1 <= seg->m_segment_position0 )
        continue;
      ON__UINT64 seg_size = (seg->m_segment_position1 - seg->m_segment_position0);
      if ( seg_size + size > m_buffer_size )
        seg_size = m_buffer_size - size;
      if ( !archive.WriteByte( (size_t)seg_size, seg->m_segment_buffer ) )
      {
        buffer_rc = false;
        break;
      }
      size += seg_size;
    }
    
    rc = true;
    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;

  return rc;
}